

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementComponent::IfcBuildingElementComponent
          (IfcBuildingElementComponent *this)

{
  IfcBuildingElementComponent *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcBuildingElement).field_0x158,"IfcBuildingElementComponent");
  IfcBuildingElement::IfcBuildingElement
            (&this->super_IfcBuildingElement,&PTR_construction_vtable_24__0108c410);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementComponent,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementComponent,_0UL> *)
             &(this->super_IfcBuildingElement).super_IfcElement.field_0x148,
             &PTR_construction_vtable_24__0108c548);
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject
       = 0x108c2e0;
  *(undefined8 *)&(this->super_IfcBuildingElement).field_0x158 = 0x108c3f8;
  *(undefined8 *)
   &(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 =
       0x108c308;
  (this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x108c330;
  *(undefined8 *)
   &(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 =
       0x108c358;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.field_0x100 =
       0x108c380;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.field_0x138 = 0x108c3a8;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.field_0x148 = 0x108c3d0;
  return;
}

Assistant:

IfcBuildingElementComponent() : Object("IfcBuildingElementComponent") {}